

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

bool __thiscall LiteScript::Namespace::DefineVariable(Namespace *this,char *name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  allocator local_81;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_50;
  
  uVar3 = ((long)(this->vars).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vars).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if ((int)uVar3 == 0) {
LAB_0013f756:
    std::__cxx11::string::string((string *)(local_80 + 0x10),name,&local_81);
    Memory::Create((Memory *)local_80,(Type *)this->memory);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_80 + 0x10),(Variable *)local_80);
    std::
    vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
    ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
              ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                *)this,&local_50);
    Variable::~Variable(&local_50.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    Variable::~Variable((Variable *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    bVar4 = true;
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(this->vars).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 == 0) {
      bVar4 = false;
    }
    else {
      uVar3 = uVar3 & 0xffffffff;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + 1;
        if (uVar2 == uVar3) goto LAB_0013f756;
        iVar1 = std::__cxx11::string::compare
                          ((char *)((this->vars).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar2));
      } while (iVar1 != 0);
      bVar4 = uVar3 <= uVar2;
    }
  }
  return bVar4;
}

Assistant:

bool LiteScript::Namespace::DefineVariable(const char *name) {
    for (unsigned int i = 0, sz = this->vars.size(); i < sz; i++) {
        if (this->vars[i].first == name)
            return false;
    }
    this->vars.push_back({ std::string(name), this->memory.Create(Type::NIL) });
    return true;
}